

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

DebuggerScope * Js::LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame *frame)

{
  int iVar1;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar2;
  DebuggerScope *this;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ScopeObjectChain *pSVar6;
  Type *pTVar7;
  DebuggerScope *unaff_RBX;
  
  iVar5 = (*frame->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
  pSVar6 = FunctionBody::GetScopeObjectChain(this_00);
  if ((pSVar6 != (ScopeObjectChain *)0x0) &&
     ((pSVar6->pScopeChain).ptr !=
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0)) {
    pLVar2 = (pSVar6->pScopeChain).ptr;
    iVar5 = (pLVar2->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
            count;
    bVar3 = 0 < iVar5;
    if (0 < iVar5) {
      pTVar7 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar2,0);
      this = pTVar7->ptr;
      bVar4 = DebuggerScope::IsParamScope(this);
      unaff_RBX = this;
      if (!bVar4) {
        iVar5 = 1;
        do {
          pLVar2 = (pSVar6->pScopeChain).ptr;
          iVar1 = (pLVar2->
                  super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
          bVar3 = iVar5 < iVar1;
          unaff_RBX = this;
          if (iVar1 <= iVar5) break;
          pTVar7 = JsUtil::
                   List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(pLVar2,iVar5);
          unaff_RBX = pTVar7->ptr;
          bVar4 = DebuggerScope::IsParamScope(unaff_RBX);
          iVar5 = iVar5 + 1;
        } while (!bVar4);
      }
    }
    if (bVar3) {
      return unaff_RBX;
    }
  }
  return (DebuggerScope *)0x0;
}

Assistant:

DebuggerScope * LocalsWalker::GetScopeWhenHaltAtFormals(DiagStackFrame* frame)
    {
        Js::ScopeObjectChain * scopeObjectChain = frame->GetJavascriptFunction()->GetFunctionBody()->GetScopeObjectChain();

        if (scopeObjectChain != nullptr && scopeObjectChain->pScopeChain != nullptr)
        {
            for (int i = 0; i < scopeObjectChain->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope * scope = scopeObjectChain->pScopeChain->Item(i);
                if (scope->IsParamScope())
                {
                    return scope;
                }
            }
        }

        return nullptr;
    }